

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3_table_column_metadata
              (sqlite3 *db,char *zDbName,char *zTableName,char *zColumnName,char **pzDataType,
              char **pzCollSeq,int *pNotNull,int *pPrimaryKey,int *pAutoinc)

{
  char *pcVar1;
  byte bVar2;
  short sVar3;
  int err_code;
  int iVar4;
  Table *pTVar5;
  char *pcVar6;
  char *pcVar7;
  Column *pCol;
  char *pcVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  ushort uVar13;
  uint uVar14;
  long in_FS_OFFSET;
  bool bVar15;
  char *zErrMsg;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = (char *)0x0;
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  if (db->noSharedCache == '\0') {
    btreeEnterAll(db);
  }
  err_code = sqlite3Init(db,&local_40);
  if ((err_code != 0) || (pTVar5 = sqlite3FindTable(db,zTableName,zDbName), pTVar5 == (Table *)0x0))
  {
LAB_0012ec62:
    pcVar7 = (char *)0x0;
    uVar12 = 0;
    pcVar6 = (char *)0x0;
    bVar15 = false;
    uVar10 = 0;
    uVar14 = 0;
    goto LAB_0012ec67;
  }
  if (pTVar5->eTabType == '\x02') {
    bVar15 = false;
    pcVar6 = (char *)0x0;
    pcVar7 = (char *)0x0;
    uVar10 = 0;
    uVar14 = 0;
    uVar12 = 0;
    goto LAB_0012ec67;
  }
  uVar13 = 1;
  pcVar6 = "INTEGER";
  if (zColumnName == (char *)0x0) {
    pcVar8 = (char *)0x0;
    bVar15 = false;
    uVar12 = 0;
  }
  else {
    sVar3 = pTVar5->nCol;
    if (0 < sVar3) {
      uVar9 = 0;
LAB_0012ee1b:
      pCol = pTVar5->aCol + uVar9;
      lVar11 = 0;
      do {
        bVar2 = pTVar5->aCol[uVar9].zCnName[lVar11];
        if (bVar2 == zColumnName[lVar11]) {
          if ((ulong)bVar2 == 0) goto LAB_0012ee72;
        }
        else if (""[bVar2] != ""[(byte)zColumnName[lVar11]]) goto LAB_0012ee52;
        lVar11 = lVar11 + 1;
      } while( true );
    }
    uVar9 = 0;
    pCol = (Column *)0x0;
LAB_0012ee72:
    uVar14 = (uint)uVar9;
    if (uVar14 == (int)sVar3) {
LAB_0012ee77:
      if (((pTVar5->tabFlags & 0x80) != 0) || (iVar4 = sqlite3IsRowid(zColumnName), iVar4 == 0))
      goto LAB_0012ec62;
      uVar14 = (uint)pTVar5->iPKey;
      if (-1 < (int)uVar14) {
        pCol = pTVar5->aCol + (ushort)pTVar5->iPKey;
        goto LAB_0012eeb9;
      }
    }
    else {
LAB_0012eeb9:
      if (pCol != (Column *)0x0) {
        uVar12 = 0;
        pcVar6 = sqlite3ColumnType(pCol,(char *)0x0);
        uVar13 = pCol->colFlags;
        pcVar8 = (char *)0x0;
        if ((uVar13 >> 9 & 1) != 0) {
          pcVar8 = pCol->zCnName + -1;
          do {
            pcVar7 = pcVar8 + 1;
            pcVar8 = pcVar8 + 1;
          } while (*pcVar7 != '\0');
          pcVar7 = pcVar8;
          if ((uVar13 & 4) != 0) {
            do {
              pcVar8 = pcVar7 + 1;
              pcVar1 = pcVar7 + 1;
              pcVar7 = pcVar8;
            } while (*pcVar1 != '\0');
          }
          pcVar8 = pcVar8 + 1;
        }
        bVar15 = (pCol->field_0x8 & 0xf) != 0;
        uVar13 = uVar13 & 1;
        if (uVar14 == (int)pTVar5->iPKey) {
          uVar12 = pTVar5->tabFlags >> 3 & 1;
        }
        goto LAB_0012ef7b;
      }
    }
    uVar12 = 0;
    pcVar8 = (char *)0x0;
    bVar15 = false;
    pcVar6 = "INTEGER";
  }
LAB_0012ef7b:
  uVar14 = (uint)uVar13;
  uVar10 = (uint)bVar15;
  pcVar7 = "BINARY";
  if (pcVar8 != (char *)0x0) {
    pcVar7 = pcVar8;
  }
  bVar15 = true;
LAB_0012ec67:
  if (db->noSharedCache == '\0') {
    btreeLeaveAll(db);
  }
  if (pzDataType != (char **)0x0) {
    *pzDataType = pcVar6;
  }
  if (pzCollSeq != (char **)0x0) {
    *pzCollSeq = pcVar7;
  }
  if (pNotNull != (int *)0x0) {
    *pNotNull = uVar10;
  }
  if (pPrimaryKey != (int *)0x0) {
    *pPrimaryKey = uVar14;
  }
  if (pAutoinc != (int *)0x0) {
    *pAutoinc = uVar12;
  }
  if (err_code == 0 && !bVar15) {
    if (local_40 != (char *)0x0) {
      sqlite3DbFreeNN(db,local_40);
    }
    local_40 = sqlite3MPrintf(db,"no such table column: %s.%s",zTableName,zColumnName);
    err_code = 1;
  }
  pcVar7 = "%s";
  if (local_40 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  iVar4 = 0;
  sqlite3ErrorWithMsg(db,err_code,pcVar7);
  if (local_40 != (char *)0x0) {
    sqlite3DbFreeNN(db,local_40);
  }
  if ((err_code != 0) || (db->mallocFailed != '\0')) {
    iVar4 = apiHandleError(db,err_code);
  }
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar4;
LAB_0012ee52:
  uVar9 = uVar9 + 1;
  if (uVar9 == (uint)(int)sVar3) goto LAB_0012ee77;
  goto LAB_0012ee1b;
}

Assistant:

SQLITE_API int sqlite3_table_column_metadata(
  sqlite3 *db,                /* Connection handle */
  const char *zDbName,        /* Database name or NULL */
  const char *zTableName,     /* Table name */
  const char *zColumnName,    /* Column name */
  char const **pzDataType,    /* OUTPUT: Declared data type */
  char const **pzCollSeq,     /* OUTPUT: Collation sequence name */
  int *pNotNull,              /* OUTPUT: True if NOT NULL constraint exists */
  int *pPrimaryKey,           /* OUTPUT: True if column part of PK */
  int *pAutoinc               /* OUTPUT: True if column is auto-increment */
){
  int rc;
  char *zErrMsg = 0;
  Table *pTab = 0;
  Column *pCol = 0;
  int iCol = 0;
  char const *zDataType = 0;
  char const *zCollSeq = 0;
  int notnull = 0;
  int primarykey = 0;
  int autoinc = 0;


#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) || zTableName==0 ){
    return SQLITE_MISUSE_BKPT;
  }
#endif

  /* Ensure the database schema has been loaded */
  sqlite3_mutex_enter(db->mutex);
  sqlite3BtreeEnterAll(db);
  rc = sqlite3Init(db, &zErrMsg);
  if( SQLITE_OK!=rc ){
    goto error_out;
  }

  /* Locate the table in question */
  pTab = sqlite3FindTable(db, zTableName, zDbName);
  if( !pTab || IsView(pTab) ){
    pTab = 0;
    goto error_out;
  }

  /* Find the column for which info is requested */
  if( zColumnName==0 ){
    /* Query for existence of table only */
  }else{
    for(iCol=0; iCol<pTab->nCol; iCol++){
      pCol = &pTab->aCol[iCol];
      if( 0==sqlite3StrICmp(pCol->zCnName, zColumnName) ){
        break;
      }
    }
    if( iCol==pTab->nCol ){
      if( HasRowid(pTab) && sqlite3IsRowid(zColumnName) ){
        iCol = pTab->iPKey;
        pCol = iCol>=0 ? &pTab->aCol[iCol] : 0;
      }else{
        pTab = 0;
        goto error_out;
      }
    }
  }

  /* The following block stores the meta information that will be returned
  ** to the caller in local variables zDataType, zCollSeq, notnull, primarykey
  ** and autoinc. At this point there are two possibilities:
  **
  **     1. The specified column name was rowid", "oid" or "_rowid_"
  **        and there is no explicitly declared IPK column.
  **
  **     2. The table is not a view and the column name identified an
  **        explicitly declared column. Copy meta information from *pCol.
  */
  if( pCol ){
    zDataType = sqlite3ColumnType(pCol,0);
    zCollSeq = sqlite3ColumnColl(pCol);
    notnull = pCol->notNull!=0;
    primarykey  = (pCol->colFlags & COLFLAG_PRIMKEY)!=0;
    autoinc = pTab->iPKey==iCol && (pTab->tabFlags & TF_Autoincrement)!=0;
  }else{
    zDataType = "INTEGER";
    primarykey = 1;
  }
  if( !zCollSeq ){
    zCollSeq = sqlite3StrBINARY;
  }

error_out:
  sqlite3BtreeLeaveAll(db);

  /* Whether the function call succeeded or failed, set the output parameters
  ** to whatever their local counterparts contain. If an error did occur,
  ** this has the effect of zeroing all output parameters.
  */
  if( pzDataType ) *pzDataType = zDataType;
  if( pzCollSeq ) *pzCollSeq = zCollSeq;
  if( pNotNull ) *pNotNull = notnull;
  if( pPrimaryKey ) *pPrimaryKey = primarykey;
  if( pAutoinc ) *pAutoinc = autoinc;

  if( SQLITE_OK==rc && !pTab ){
    sqlite3DbFree(db, zErrMsg);
    zErrMsg = sqlite3MPrintf(db, "no such table column: %s.%s", zTableName,
        zColumnName);
    rc = SQLITE_ERROR;
  }
  sqlite3ErrorWithMsg(db, rc, (zErrMsg?"%s":0), zErrMsg);
  sqlite3DbFree(db, zErrMsg);
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}